

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zMaster)

{
  BtShared *pBt_00;
  int iVar1;
  BtShared *pBt;
  int rc;
  char *zMaster_local;
  Btree *p_local;
  
  pBt._4_4_ = 0;
  if (p->inTrans == '\x02') {
    pBt_00 = p->pBt;
    sqlite3BtreeEnter(p);
    if ((pBt_00->autoVacuum != '\0') && (iVar1 = autoVacuumCommit(pBt_00), iVar1 != 0)) {
      sqlite3BtreeLeave(p);
      return iVar1;
    }
    if (pBt_00->bDoTruncate != '\0') {
      sqlite3PagerTruncateImage(pBt_00->pPager,pBt_00->nPage);
    }
    pBt._4_4_ = sqlite3PagerCommitPhaseOne(pBt_00->pPager,zMaster,0);
    sqlite3BtreeLeave(p);
  }
  return pBt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zMaster){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(pBt);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zMaster, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}